

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O0

Element ftxui::filler(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Element EVar1;
  shared_ptr<ftxui::(anonymous_namespace)::Flex> local_20;
  
  std::make_shared<ftxui::(anonymous_namespace)::Flex,void(&)(ftxui::Requirement&)>
            ((_func_void_Requirement_ptr *)&local_20);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::(anonymous_namespace)::Flex,void>
            ((shared_ptr<ftxui::Node> *)in_RDI,&local_20);
  std::shared_ptr<ftxui::(anonymous_namespace)::Flex>::~shared_ptr(&local_20);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element filler() {
  return std::make_shared<Flex>(function_flex);
}